

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vampire.cpp
# Opt level: O0

void outputProblemToLaTeX(Problem *prb)

{
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  Unit *u_00;
  string *psVar4;
  ostream *poVar5;
  ostream *this;
  UnitList **ppUVar6;
  Problem *in_RDI;
  Unit *u;
  uint index;
  Iterator units;
  ofstream latexOut;
  LaTeX latex;
  Options *in_stack_fffffffffffffd08;
  Iterator *in_stack_fffffffffffffd10;
  LaTeX *in_stack_fffffffffffffd38;
  LaTeX *latex_00;
  string local_298 [32];
  Unit *local_278;
  int local_26c;
  Iterator local_268;
  string local_260 [48];
  LaTeX local_230 [32];
  ostream local_210 [519];
  LaTeX local_9;
  Problem *local_8;
  
  local_8 = in_RDI;
  Shell::LaTeX::LaTeX(&local_9);
  latex_00 = local_230;
  Shell::Options::latexOutput_abi_cxx11_(in_stack_fffffffffffffd08);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_210,pcVar2,_S_out);
  std::__cxx11::string::~string((string *)local_230);
  Shell::LaTeX::header_abi_cxx11_(in_stack_fffffffffffffd38);
  poVar3 = std::operator<<(local_210,local_260);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_260);
  u_00 = (Unit *)std::operator<<(local_210,"\\section{Problem ");
  psVar4 = Shell::Options::problemName_abi_cxx11_(Lib::env);
  poVar5 = std::operator<<((ostream *)u_00,(string *)psVar4);
  poVar5 = std::operator<<(poVar5,"}");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  this = std::operator<<(local_210,"\\[\n\\begin{array}{ll}");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  ppUVar6 = Kernel::Problem::units(local_8);
  Lib::List<Kernel::Unit_*>::Iterator::Iterator(&local_268,*ppUVar6);
  local_26c = 0;
  while( true ) {
    bVar1 = Lib::List<Kernel::Unit_*>::Iterator::hasNext((Iterator *)0x1842ac);
    if (!bVar1) break;
    local_278 = Lib::List<Kernel::Unit_*>::Iterator::next(in_stack_fffffffffffffd10);
    local_26c = local_26c + 1;
    outputUnitToLaTeX(latex_00,(ofstream *)poVar3,u_00,(uint)((ulong)psVar4 >> 0x20));
  }
  poVar3 = std::operator<<(local_210,"\\end{array}\n\\]");
  Shell::LaTeX::footer_abi_cxx11_((LaTeX *)poVar5);
  poVar3 = std::operator<<(poVar3,local_298);
  std::operator<<(poVar3,"\n");
  std::__cxx11::string::~string(local_298);
  std::ofstream::~ofstream(local_210);
  return;
}

Assistant:

void outputProblemToLaTeX(Problem* prb)
{
  ASS(env.options->latexOutput()!="off");

  LaTeX latex;
  ofstream latexOut(env.options->latexOutput().c_str());
  latexOut << latex.header() << endl;
  latexOut << "\\section{Problem "<<env.options->problemName() << "}" << endl;
  //TODO output more header
  latexOut << "\\[\n\\begin{array}{ll}" << endl;

  //TODO  get symbol and sort declarations into LaTeX

  UnitList::Iterator units(prb->units());

  unsigned index = 0;
  while (units.hasNext()) {
    Unit* u = units.next();
    outputUnitToLaTeX(latex,latexOut,u,index++);
  }
  latexOut  << "\\end{array}\n\\]" << latex.footer() << "\n";

  //close ofstream?
}